

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_type.cpp
# Opt level: O1

string * __thiscall
cppcms::http::content_type::subtype_abi_cxx11_(string *__return_storage_ptr__,content_type *this)

{
  element_type *peVar1;
  pointer pcVar2;
  
  peVar1 = (this->d).
           super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (peVar1->subtype)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (peVar1->subtype)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string content_type::subtype() const
	{
		if(d)
			return d->subtype;
		return std::string();
	}